

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall llama_vocab::impl::init_tokenizer(impl *this,llama_vocab_type type)

{
  llm_tokenizer *plVar1;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var2;
  impl *in_RAX;
  llm_tokenizer *plVar3;
  undefined *puVar4;
  _Head_base<0UL,_llama_vocab::impl_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: initializing tokenizer for type %d\n",
                     "init_tokenizer",(ulong)type);
  switch(type) {
  case LLAMA_VOCAB_TYPE_SPM:
    plVar3 = (llm_tokenizer *)operator_new(8);
    puVar4 = &llm_tokenizer_spm::vtable;
    goto LAB_0024fec6;
  case LLAMA_VOCAB_TYPE_BPE:
    ::std::make_unique<llm_tokenizer_bpe,llama_vocab_const&>((llama_vocab *)&local_18);
    break;
  case LLAMA_VOCAB_TYPE_WPM:
    plVar3 = (llm_tokenizer *)operator_new(8);
    puVar4 = &llm_tokenizer_wpm::vtable;
LAB_0024fec6:
    plVar3->_vptr_llm_tokenizer = (_func_int **)(puVar4 + 0x10);
    plVar1 = (this->tokenizer)._M_t.
             super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
             super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
             super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl;
    (this->tokenizer)._M_t.super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>
    ._M_t.super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
    super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl = plVar3;
    if (plVar1 == (llm_tokenizer *)0x0) {
      return;
    }
    (*plVar1->_vptr_llm_tokenizer[1])();
    return;
  case LLAMA_VOCAB_TYPE_UGM:
    ::std::make_unique<llm_tokenizer_ugm,llama_vocab_const&,std::vector<char,std::allocator<char>>&>
              ((llama_vocab *)&local_18,(vector<char,_std::allocator<char>_> *)this->vocab);
    break;
  case LLAMA_VOCAB_TYPE_RWKV:
    ::std::make_unique<llm_tokenizer_rwkv,llama_vocab_const&>((llama_vocab *)&local_18);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x88f,"unsupported vocab type");
  }
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (impl *)0x0;
  plVar3 = (this->tokenizer)._M_t.
           super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
           super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
           super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl;
  (this->tokenizer)._M_t.super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>.
  _M_t.super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
  super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl = (llm_tokenizer *)_Var2._M_head_impl;
  if ((plVar3 != (llm_tokenizer *)0x0) &&
     ((*plVar3->_vptr_llm_tokenizer[1])(), local_18._M_head_impl != (impl *)0x0)) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  return;
}

Assistant:

void llama_vocab::impl::init_tokenizer(enum llama_vocab_type type) {
    LLAMA_LOG_DEBUG("%s: initializing tokenizer for type %d\n", __func__, type);

    switch (type) {
        case LLAMA_VOCAB_TYPE_SPM:
            tokenizer = std::make_unique<llm_tokenizer_spm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_BPE:
            tokenizer = std::make_unique<llm_tokenizer_bpe>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_WPM:
            tokenizer = std::make_unique<llm_tokenizer_wpm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_UGM:
            tokenizer = std::make_unique<llm_tokenizer_ugm>(vocab, precompiled_charsmap);
            break;
        case LLAMA_VOCAB_TYPE_RWKV:
            tokenizer = std::make_unique<llm_tokenizer_rwkv>(vocab);
            break;
        default:
            GGML_ABORT("unsupported vocab type");
    }
}